

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshints.c
# Opt level: O1

CF2_F16Dot16 cf2_hintmap_map(CF2_HintMap hintmap,CF2_F16Dot16 csCoord)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  CF2_F16Dot16 *pCVar6;
  bool bVar7;
  
  if ((hintmap->count == 0) || (hintmap->hinted == '\0')) {
    lVar5 = (long)csCoord * (long)hintmap->scale;
    return (CF2_F16Dot16)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10);
  }
  uVar4 = hintmap->lastIndex;
  uVar2 = hintmap->count - 1;
  if (uVar2 < uVar4) {
    uVar2 = uVar4;
  }
  uVar3 = (ulong)uVar2;
  lVar5 = 0;
  pCVar6 = &hintmap->edge[(ulong)uVar4 + 1].csCoord;
  do {
    if (uVar4 - uVar3 == lVar5) goto LAB_00156361;
    lVar5 = lVar5 + -1;
    iVar1 = *pCVar6;
    pCVar6 = pCVar6 + 8;
  } while (iVar1 <= csCoord);
  uVar3 = (ulong)(~(uint)lVar5 + uVar4);
LAB_00156361:
  uVar4 = (uint)uVar3;
  bVar7 = uVar4 == 0;
  if (bVar7) {
LAB_001563c3:
    hintmap->lastIndex = uVar4;
  }
  else {
    iVar1 = hintmap->edge[uVar3].csCoord;
    while (csCoord < iVar1) {
      uVar4 = uVar4 - 1;
      bVar7 = uVar4 == 0;
      if (bVar7) {
        uVar4 = 0;
        goto LAB_001563c3;
      }
      iVar1 = hintmap->edge[uVar4].csCoord;
    }
    hintmap->lastIndex = uVar4;
    if (!bVar7) goto LAB_001563f0;
  }
  iVar1 = hintmap->edge[0].csCoord;
  if (csCoord < iVar1) {
    lVar5 = (long)(csCoord - iVar1) * (long)hintmap->scale;
    return (int)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10) + hintmap->edge[0].dsCoord;
  }
LAB_001563f0:
  lVar5 = (long)(csCoord - hintmap->edge[uVar4].csCoord) * (long)hintmap->edge[uVar4].scale;
  return (int)((ulong)((lVar5 >> 0x3f) + lVar5 + 0x8000) >> 0x10) + hintmap->edge[uVar4].dsCoord;
}

Assistant:

static CF2_Fixed
  cf2_hintmap_map( CF2_HintMap  hintmap,
                   CF2_Fixed    csCoord )
  {
    if ( hintmap->count == 0 || ! hintmap->hinted )
    {
      /* there are no hints; use uniform scale and zero offset */
      return FT_MulFix( csCoord, hintmap->scale );
    }
    else
    {
      /* start linear search from last hit */
      CF2_UInt  i = hintmap->lastIndex;


      FT_ASSERT( hintmap->lastIndex < CF2_MAX_HINT_EDGES );

      /* search up */
      while ( i < hintmap->count - 1                  &&
              csCoord >= hintmap->edge[i + 1].csCoord )
        i += 1;

      /* search down */
      while ( i > 0 && csCoord < hintmap->edge[i].csCoord )
        i -= 1;

      hintmap->lastIndex = i;

      if ( i == 0 && csCoord < hintmap->edge[0].csCoord )
      {
        /* special case for points below first edge: use uniform scale */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[0].csCoord ),
                                     hintmap->scale ),
                          hintmap->edge[0].dsCoord );
      }
      else
      {
        /*
         * Note: entries with duplicate csCoord are allowed.
         * Use edge[i], the highest entry where csCoord >= entry[i].csCoord
         */
        return ADD_INT32( FT_MulFix( SUB_INT32( csCoord,
                                                hintmap->edge[i].csCoord ),
                                     hintmap->edge[i].scale ),
                          hintmap->edge[i].dsCoord );
      }
    }
  }